

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall
testing::internal::DeathTestImpl::DeathTestImpl(DeathTestImpl *this,char *a_statement,RE *a_regex)

{
  DeathTest::DeathTest(&this->super_DeathTest);
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0014b888;
  this->statement_ = a_statement;
  this->regex_ = a_regex;
  this->spawned_ = false;
  this->status_ = -1;
  this->outcome_ = IN_PROGRESS;
  this->read_fd_ = -1;
  this->write_fd_ = -1;
  return;
}

Assistant:

DeathTestImpl(const char* a_statement, const RE* a_regex)
      : statement_(a_statement),
        regex_(a_regex),
        spawned_(false),
        status_(-1),
        outcome_(IN_PROGRESS),
        read_fd_(-1),
        write_fd_(-1) {}